

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.hpp
# Opt level: O0

void __thiscall spirv_cross::CompilerGLSL::CompilerGLSL(CompilerGLSL *this,ParsedIR *ir_)

{
  ParsedIR *ir__local;
  CompilerGLSL *this_local;
  
  Compiler::Compiler(&this->super_Compiler,ir_);
  (this->super_Compiler)._vptr_Compiler = (_func_int **)&PTR__CompilerGLSL_005becd0;
  this->current_emitting_block = (SPIRBlock *)0x0;
  SmallVector<spirv_cross::SPIRBlock_*,_8UL>::SmallVector(&this->current_emitting_switch_stack);
  this->current_emitting_switch_fallthrough = false;
  StringStream<4096UL,_4096UL>::StringStream(&this->buffer);
  this->redirect_statement =
       (SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
        *)0x0;
  this->current_continue_block = (SPIRBlock *)0x0;
  this->block_temporary_hoisting = false;
  this->block_debug_directives = false;
  Options::Options(&this->options);
  ::std::
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::unordered_set(&this->local_variable_names);
  ::std::
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::unordered_set(&this->resource_names);
  ::std::
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::unordered_set(&this->block_input_names);
  ::std::
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::unordered_set(&this->block_output_names);
  ::std::
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::unordered_set(&this->block_ubo_names);
  ::std::
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::unordered_set(&this->block_ssbo_names);
  ::std::
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::unordered_set(&this->block_names);
  ::std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>
  ::unordered_map(&this->function_overloads);
  ::std::
  unordered_map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::unordered_map(&this->preserved_aliases);
  this->processing_entry_point = false;
  BackendVariations::BackendVariations(&this->backend);
  this->indent = 0;
  ::std::
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  ::unordered_set(&this->emitted_functions);
  ::std::
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  ::unordered_set(&this->flushed_phi_variables);
  ::std::
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  ::unordered_set(&this->flattened_buffer_blocks);
  ::std::
  unordered_map<unsigned_int,_bool,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_bool>_>_>
  ::unordered_map(&this->flattened_structs);
  ShaderSubgroupSupportHelper::ShaderSubgroupSupportHelper(&this->shader_subgroup_supporter);
  ::std::
  unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  ::unordered_map(&this->expression_usage_counts);
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  ::SmallVector(&this->forced_extensions);
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  ::SmallVector(&this->header_lines);
  ::std::
  unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  ::unordered_map(&this->extra_sub_expressions);
  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL>::SmallVector
            (&this->workaround_ubo_load_overload_types);
  this->statement_count = 0;
  this->required_polyfills = 0;
  this->required_polyfills_relaxed = 0;
  this->ray_tracing_is_khr = false;
  this->barycentric_is_nv = false;
  ::std::vector<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>::vector
            (&this->pls_inputs);
  ::std::vector<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>::vector
            (&this->pls_outputs);
  ::std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::vector(&this->subpass_to_framebuffer_fetch_attachment);
  ::std::vector<std::pair<unsigned_int,_bool>,_std::allocator<std::pair<unsigned_int,_bool>_>_>::
  vector(&this->inout_color_attachments);
  ::std::
  unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  ::unordered_map(&this->temporary_to_mirror_precision_alias);
  ::std::
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  ::unordered_set(&this->composite_insert_overwritten);
  ::std::
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  ::unordered_set(&this->block_composite_insert_overwrite);
  this->current_locale_radix_character = '.';
  ::std::
  unordered_set<spirv_cross::LocationComponentPair,_spirv_cross::InternalHasher,_std::equal_to<spirv_cross::LocationComponentPair>,_std::allocator<spirv_cross::LocationComponentPair>_>
  ::unordered_set(&this->masked_output_locations);
  ::std::
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  ::unordered_set(&this->masked_output_builtins);
  this->float_formatter = (FloatFormatter *)0x0;
  ::std::
  unordered_map<unsigned_int,_spirv_cross::SmallVector<spirv_cross::TypedID<(spirv_cross::Types)3>,_8UL>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::SmallVector<spirv_cross::TypedID<(spirv_cross::Types)3>,_8UL>_>_>_>
  ::unordered_map(&this->const_composite_insert_ids);
  init(this,(EVP_PKEY_CTX *)ir_);
  return;
}

Assistant:

explicit CompilerGLSL(const ParsedIR &ir_)
	    : Compiler(ir_)
	{
		init();
	}